

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O2

bool __thiscall cmParsePHPCoverage::ReadPHPData(cmParsePHPCoverage *this,char *file)

{
  cmCTest *this_00;
  cmParsePHPCoverage *this_01;
  char c;
  int size;
  char *local_3d0 [4];
  ostringstream cmCTestLog_msg;
  ifstream in;
  byte abStack_218 [488];
  
  this_01 = (cmParsePHPCoverage *)&in;
  std::ifstream::ifstream(this_01,file,_S_in);
  if ((abStack_218[_in[-1].TotalCoverage._M_t._M_impl.super__Rb_tree_header._M_node_count] & 5) == 0
     ) {
    size = 0;
    ReadArraySize(this_01,(istream *)&in,&size);
    std::istream::get((char *)&in);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"failed to read open array\n");
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0xb9,local_3d0[0],false);
    std::__cxx11::string::~string((string *)local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::ifstream::~ifstream(&in);
  return false;
}

Assistant:

bool cmParsePHPCoverage::ReadPHPData(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    return false;
  }
  int size = 0;
  this->ReadArraySize(in, size);
  char c = 0;
  in.get(c);
  if (c != '{') {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read open array\n");
    return false;
  }
  for (int i = 0; i < size; i++) {
    if (!this->ReadFileInformation(in)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Failed to read file #" << i << "\n");
      return false;
    }
    in.get(c);
    if (c != '}') {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read close array\n");
      return false;
    }
  }
  return true;
}